

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

P_Sequence * parse(s_i *prog)

{
  undefined1 auVar1 [16];
  undefined1 uVar2;
  uint uVar3;
  Token *pTVar4;
  long *plVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  pointer pDVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  _func_int **pp_Var14;
  long lVar15;
  Token *pTVar16;
  undefined1 *puVar17;
  Token *extraout_RAX;
  Token *extraout_RAX_00;
  Token *extraout_RAX_01;
  Pattern *pPVar18;
  long lVar19;
  Pattern *pPVar20;
  Pattern *pPVar21;
  P_Sequence *pPVar22;
  undefined8 *puVar23;
  undefined **ppuVar24;
  iterator iVar25;
  const_iterator __begin1;
  pointer ppTVar26;
  pointer pDVar27;
  iterator iVar28;
  const_iterator __end1;
  Token **ppTVar29;
  vector<Token_*,_std::allocator<Token_*>_> tokens0;
  Token *tok;
  vector<Token_*,_std::allocator<Token_*>_> tokens1;
  Token *tok_2;
  vector<Token_*,_std::allocator<Token_*>_> local_e8;
  vector<Direction,_std::allocator<Direction>_> local_c8;
  uint local_ac;
  Token *local_a8;
  iterator iStack_a0;
  Pattern **local_98;
  Token **local_88;
  iterator iStack_80;
  Token **local_78;
  Token *local_70;
  undefined1 local_68 [16];
  Token **local_58;
  Token **local_50;
  vector<Token_*,_std::allocator<Token_*>_> local_48;
  
  local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Token **)0x0;
  local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Token **)0x0;
switchD_0010a5d9_caseD_9:
  iVar10 = s_i::get(prog);
  switch(iVar10) {
  case 0x5c:
    pTVar16 = (Token *)operator_new(0x10);
    pp_Var14 = (_func_int **)operator_new(0x10);
    iVar10 = s_i::get(prog);
    *pp_Var14 = (_func_int *)&PTR__Pattern_00113890;
    *(int *)(pp_Var14 + 1) = iVar10;
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_001137b0;
    pTVar16[1]._vptr_Token = pp_Var14;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) break;
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_e8,
               (iterator)
               local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Token **)&local_c8);
    goto switchD_0010a5d9_caseD_9;
  case 0x5d:
  case 0x5f:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x76:
  case 0x78:
    goto switchD_0010a59d_caseD_5d;
  case 0x5e:
    pTVar16 = (Token *)operator_new(0x10);
    pp_Var14 = (_func_int **)operator_new(0x10);
    iVar10 = s_i::get(prog);
    *pp_Var14 = (_func_int *)&PTR__Pattern_001138e0;
    *(int *)(pp_Var14 + 1) = iVar10;
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_001137b0;
    pTVar16[1]._vptr_Token = pp_Var14;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a5d9_caseD_9;
    }
    break;
  case 0x60:
    pTVar16 = (Token *)operator_new(8);
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113ad8;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0010a732;
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_e8,
               (iterator)
               local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Token **)&local_c8);
    goto switchD_0010a5d9_caseD_9;
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x72:
  case 0x73:
  case 0x75:
  case 0x77:
  case 0x79:
  case 0x7a:
    if (prog->utf8 == true) {
      prog->i = prog->i + -1;
    }
    else {
      prog->i = prog->i + -1;
    }
    pTVar16 = (Token *)operator_new(0x10);
    pp_Var14 = (_func_int **)operator_new(0x20);
    read_dirs(&local_c8,prog,true);
    *pp_Var14 = (_func_int *)&PTR__DirectionAlternation_00113750;
    std::vector<Direction,_std::allocator<Direction>_>::vector
              ((vector<Direction,_std::allocator<Direction>_> *)(pp_Var14 + 1),&local_c8);
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_001137b0;
    pTVar16[1]._vptr_Token = pp_Var14;
    local_a8 = pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_a8);
    }
    else {
      *local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
       super__Vector_impl_data._M_finish = pTVar16;
      local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
    }
    if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    goto switchD_0010a5d9_caseD_9;
  case 0x74:
    pTVar16 = (Token *)operator_new(0x10);
    pp_Var14 = (_func_int **)operator_new(8);
    *pp_Var14 = (_func_int *)&PTR__Pattern_00113bb8;
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_001137b0;
    pTVar16[1]._vptr_Token = pp_Var14;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a5d9_caseD_9;
    }
    break;
  case 0x7b:
    pTVar16 = (Token *)operator_new(0x10);
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_001139f8;
    *(undefined4 *)&pTVar16[1]._vptr_Token = 2;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0010a732;
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_e8,
               (iterator)
               local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Token **)&local_c8);
    goto switchD_0010a5d9_caseD_9;
  case 0x7c:
    pTVar16 = (Token *)operator_new(8);
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113988;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0010a732;
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_e8,
               (iterator)
               local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Token **)&local_c8);
    goto switchD_0010a5d9_caseD_9;
  case 0x7d:
    pTVar16 = (Token *)operator_new(0x10);
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113a68;
    *(undefined4 *)&pTVar16[1]._vptr_Token = 2;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0010a732;
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_e8,
               (iterator)
               local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Token **)&local_c8);
    goto switchD_0010a5d9_caseD_9;
  case 0x7e:
    pTVar16 = (Token *)operator_new(0x10);
    pp_Var14 = (_func_int **)operator_new(8);
    *pp_Var14 = (_func_int *)&PTR__Pattern_00113950;
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_001137b0;
    pTVar16[1]._vptr_Token = pp_Var14;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a5d9_caseD_9;
    }
    break;
  default:
    goto code_r0x0010a5cb;
  }
LAB_0010aaf5:
  *local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
   _M_finish = pTVar16;
  local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
              super__Vector_impl_data._M_finish + 1;
  goto switchD_0010a5d9_caseD_9;
code_r0x0010a5cb:
  switch(iVar10) {
  case 9:
  case 10:
  case 0xd:
  case 0x20:
    goto switchD_0010a5d9_caseD_9;
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x2a:
  case 0x2d:
  case 0x2f:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3e:
    goto switchD_0010a59d_caseD_5d;
  case 0x21:
    pTVar16 = (Token *)operator_new(0x20);
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113b48;
    *(undefined1 *)&pTVar16[1]._vptr_Token = 0;
    *(undefined1 (*) [16])(pTVar16 + 2) = (undefined1  [16])0x0;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a5d9_caseD_9;
    }
    break;
  case 0x28:
    pTVar16 = (Token *)operator_new(0x10);
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_001139f8;
    *(undefined4 *)&pTVar16[1]._vptr_Token = 1;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a5d9_caseD_9;
    }
    break;
  case 0x29:
    pTVar16 = (Token *)operator_new(0x10);
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113a68;
    *(undefined4 *)&pTVar16[1]._vptr_Token = 1;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a5d9_caseD_9;
    }
    break;
  case 0x2b:
    iVar10 = s_i::peek(prog,0);
    if (iVar10 == 0x3f) {
      s_i::get(prog);
      pTVar16 = (Token *)operator_new(0x10);
      pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113820;
      pTVar16[1]._vptr_Token = (_func_int **)0x1ffffffff;
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pTVar16;
      if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,(Token **)&local_c8);
        goto switchD_0010a5d9_caseD_9;
      }
    }
    else {
      pTVar16 = (Token *)operator_new(0x10);
      pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113820;
      pTVar16[1]._vptr_Token = (_func_int **)0xffffffff00000001;
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pTVar16;
      if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,(Token **)&local_c8);
        goto switchD_0010a5d9_caseD_9;
      }
    }
    break;
  case 0x2c:
    iVar10 = s_i::peek(prog,0);
    if (iVar10 == 0x2c) {
      do {
        iVar10 = s_i::get(prog);
        if (iVar10 == -1) break;
      } while (iVar10 != 10);
      goto switchD_0010a5d9_caseD_9;
    }
    iVar10 = s_i::peek(prog,0);
    iVar13 = -1;
    if (iVar10 - 0x30U < 10) {
      iVar13 = read_num(prog);
    }
    pTVar16 = (Token *)operator_new(0x10);
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113820;
    *(undefined4 *)&pTVar16[1]._vptr_Token = 0;
    *(int *)((long)&pTVar16[1]._vptr_Token + 4) = iVar13;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a5d9_caseD_9;
    }
    break;
  case 0x2e:
    pTVar16 = (Token *)operator_new(0x10);
    pp_Var14 = (_func_int **)operator_new(8);
    *pp_Var14 = (_func_int *)&PTR__Pattern_00113918;
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_001137b0;
    pTVar16[1]._vptr_Token = pp_Var14;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a5d9_caseD_9;
    }
    goto LAB_0010aaf5;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    if (prog->utf8 == true) {
      prog->i = prog->i + -1;
    }
    else {
      prog->i = prog->i + -1;
    }
    iVar13 = read_num(prog);
    iVar11 = s_i::peek(prog,0);
    iVar10 = iVar13;
    if ((iVar11 == 0x2c) && (iVar11 = s_i::peek(prog,1), iVar11 != 0x2c)) {
      s_i::get(prog);
      iVar11 = s_i::peek(prog,0);
      iVar10 = -1;
      if (iVar11 - 0x30U < 10) {
        iVar10 = read_num(prog);
      }
    }
    pTVar16 = (Token *)operator_new(0x10);
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113820;
    *(int *)&pTVar16[1]._vptr_Token = iVar13;
    *(int *)((long)&pTVar16[1]._vptr_Token + 4) = iVar10;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a5d9_caseD_9;
    }
    break;
  case 0x3d:
    pTVar16 = (Token *)operator_new(0x20);
    pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113b48;
    *(undefined1 *)&pTVar16[1]._vptr_Token = 1;
    *(undefined1 (*) [16])(pTVar16 + 2) = (undefined1  [16])0x0;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar16;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a5d9_caseD_9;
    }
    break;
  case 0x3f:
    iVar10 = s_i::peek(prog,0);
    if (iVar10 == 0x3f) {
      s_i::get(prog);
      pTVar16 = (Token *)operator_new(0x10);
      pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113820;
      pTVar16[1]._vptr_Token = (_func_int **)0x1;
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pTVar16;
      if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,(Token **)&local_c8);
        goto switchD_0010a5d9_caseD_9;
      }
    }
    else {
      pTVar16 = (Token *)operator_new(0x10);
      pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113820;
      pTVar16[1]._vptr_Token = (_func_int **)0x100000000;
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pTVar16;
      if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,(Token **)&local_c8);
        goto switchD_0010a5d9_caseD_9;
      }
    }
    break;
  default:
    if (iVar10 == -1) {
      std::vector<Token_*,_std::allocator<Token_*>_>::vector(&local_48,&local_e8);
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_48.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_48.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_0010ae9a;
      pTVar16 = (Token *)0x0;
      ppTVar26 = local_48.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      goto LAB_0010ad41;
    }
    goto switchD_0010a59d_caseD_5d;
  }
LAB_0010a732:
  *local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
   _M_finish = pTVar16;
  local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
              super__Vector_impl_data._M_finish + 1;
  goto switchD_0010a5d9_caseD_9;
switchD_0010a59d_caseD_5d:
  puVar23 = (undefined8 *)__cxa_allocate_exception(0x18);
  iVar10 = *(int *)&prog->i;
  iVar13 = *(int *)&(prog->s->_M_dataplus)._M_p;
  *puVar23 = &PTR__exception_001136c0;
  puVar23[1] = "Unrecognized instruction";
  *(int *)(puVar23 + 2) = iVar10 - iVar13;
  __cxa_throw(puVar23,&parse_exc::typeinfo,std::exception::~exception);
LAB_0010ad41:
  do {
    pTVar4 = *ppTVar26;
    local_a8 = pTVar4;
    if (pTVar4 == (Token *)0x0) {
LAB_0010adee:
      if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*const&>
                  ((vector<Token*,std::allocator<Token*>> *)&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_a8);
      }
      else {
        *(Token **)
         local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
         super__Vector_impl_data._M_finish = pTVar4;
        local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 8);
      }
      pTVar16 = (Token *)0x0;
    }
    else {
      lVar15 = __dynamic_cast(pTVar4,&Token::typeinfo,&T_Assert::typeinfo,0);
      if (lVar15 == 0) {
        if ((pTVar16 == (Token *)0x0) ||
           (lVar15 = __dynamic_cast(pTVar4,&Token::typeinfo,&T_Pattern::typeinfo,0), lVar15 == 0))
        goto LAB_0010adee;
        if ((pTVar16[2]._vptr_Token == (_func_int **)0x0) &&
           ((pp_Var14 = *(_func_int ***)(lVar15 + 8), pp_Var14 != (_func_int **)0x0 &&
            (lVar19 = __dynamic_cast(pp_Var14,&AST::Pattern::typeinfo,&AST::Teleport::typeinfo,0),
            lVar19 != 0)))) {
          pTVar16[2]._vptr_Token = pp_Var14;
        }
        else {
          if ((pTVar16[3]._vptr_Token != (_func_int **)0x0) ||
             ((pp_Var14 = *(_func_int ***)(lVar15 + 8), pp_Var14 == (_func_int **)0x0 ||
              (lVar15 = __dynamic_cast(pp_Var14,&AST::Pattern::typeinfo,
                                       &AST::DirectionAlternation::typeinfo,0), lVar15 == 0))))
          goto LAB_0010adee;
          pTVar16[3]._vptr_Token = pp_Var14;
        }
      }
      else {
        pTVar16 = (Token *)operator_new(0x20);
        uVar2 = *(undefined1 *)(lVar15 + 8);
        pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113b48;
        *(undefined1 *)&pTVar16[1]._vptr_Token = uVar2;
        *(undefined1 (*) [16])(pTVar16 + 2) = (undefined1  [16])0x0;
        local_68._0_8_ = pTVar16;
        if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                    ((vector<Token*,std::allocator<Token*>> *)&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                     super__Vector_impl_data._M_finish,(Token **)local_68);
        }
        else {
          *(Token **)
           local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
           super__Vector_impl_data._M_finish = pTVar16;
          local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((long)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8);
        }
      }
    }
    ppTVar26 = ppTVar26 + 1;
  } while (ppTVar26 !=
           local_48.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
           super__Vector_impl_data._M_finish);
LAB_0010ae9a:
  local_88 = (Token **)0x0;
  iStack_80._M_current = (Token **)0x0;
  local_78 = (Token **)0x0;
  if (insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::cat == '\0') {
    parse();
  }
  if ((insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty == '\0') &&
     (iVar10 = __cxa_guard_acquire(&insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)
                                    ::empty), iVar10 != 0)) {
    insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty._8_8_ =
         operator_new(8);
    *(undefined ***)
     insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty._8_8_ =
         &PTR__Pattern_00113c60;
    insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty._0_8_ =
         &PTR__Token_001137b0;
    __cxa_guard_release(&insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::
                         empty);
  }
  pTVar16 = (Token *)operator_new(0x10);
  pTVar16->_vptr_Token = (_func_int **)&PTR__Token_001139f8;
  *(undefined4 *)&pTVar16[1]._vptr_Token = 0;
  if (iStack_80._M_current == local_78) {
    local_a8 = pTVar16;
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,&local_a8);
  }
  else {
    *iStack_80._M_current = pTVar16;
    iStack_80._M_current = iStack_80._M_current + 1;
  }
  pDVar9 = local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar8 = true;
    uVar12 = 0;
    local_58 = (Token **)0x10f47c;
    pDVar27 = local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_a8 = *(Token **)pDVar27;
      iVar10 = (*local_a8->_vptr_Token[4])();
      if (((char)iVar10 == '\0') && (iVar10 = (*local_a8->_vptr_Token[2])(), (char)iVar10 == '\0'))
      {
        iVar10 = (*local_a8->_vptr_Token[6])();
        pTVar16 = local_a8;
        if ((char)iVar10 == '\0') {
          if ((uVar12 & 1) != 0) {
LAB_0010b8d1:
            puVar23 = (undefined8 *)__cxa_allocate_exception(0x18);
            *puVar23 = &PTR__exception_001136c0;
            puVar23[1] = local_58;
            *(undefined4 *)(puVar23 + 2) = 0xffffffff;
            __cxa_throw(puVar23,&parse_exc::typeinfo,std::exception::~exception);
          }
          if ((local_a8 == (Token *)0x0) ||
             (lVar15 = __dynamic_cast(local_a8,&Token::typeinfo,&T_Alternator::typeinfo,0),
             lVar15 == 0)) {
            iVar10 = (*pTVar16->_vptr_Token[5])(pTVar16);
            if ((char)iVar10 == '\0') {
              iVar10 = (*local_a8->_vptr_Token[7])();
              if ((char)iVar10 == '\0') {
                __assert_fail("tok->isGroupCloser()",
                              "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                              ,0x125,"vector<Token *> insert_concatenators(const vector<Token *> &)"
                             );
              }
              if (bVar8) {
                local_68._0_8_ =
                     insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty;
                if (iStack_80._M_current == local_78) {
                  std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                            ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,
                             (Token **)local_68);
                }
                else {
                  *iStack_80._M_current =
                       (Token *)insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)
                                ::empty;
                  iStack_80._M_current = iStack_80._M_current + 1;
                }
              }
              goto LAB_0010af72;
            }
            if (bVar8) {
              local_58 = (Token **)0x10f48e;
              goto LAB_0010b8d1;
            }
            goto LAB_0010b0e6;
          }
          if (bVar8) {
            puVar17 = insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty;
            local_68._0_8_ =
                 insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty;
            if (iStack_80._M_current != local_78) goto LAB_0010b054;
            std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                      ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,
                       (Token **)local_68);
          }
        }
        else if (((uVar12 & 1) == 0) && (!bVar8)) {
          puVar17 = (undefined1 *)
                    &insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::cat;
          local_68._0_8_ =
               &insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::cat;
          if (iStack_80._M_current == local_78) {
            std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                      ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,
                       (Token **)local_68);
          }
          else {
LAB_0010b054:
            *iStack_80._M_current = (Token *)puVar17;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
        }
        bVar8 = true;
      }
      else if ((uVar12 & 1) == 0) {
        if (bVar8) {
LAB_0010af72:
          bVar8 = false;
        }
        else {
          local_68._0_8_ =
               &insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::cat;
          if (iStack_80._M_current == local_78) {
            std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                      ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,
                       (Token **)local_68);
          }
          else {
            *iStack_80._M_current =
                 (Token *)&insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::
                           cat;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
        }
      }
LAB_0010b0e6:
      if (iStack_80._M_current == local_78) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*const&>
                  ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,&local_a8);
      }
      else {
        *iStack_80._M_current = local_a8;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      uVar12 = (*local_a8->_vptr_Token[4])();
      pDVar27 = (pointer)(pDVar27->x + 1);
    } while (pDVar27 != pDVar9);
    if ((char)uVar12 != '\0') {
      puVar23 = (undefined8 *)__cxa_allocate_exception(0x18);
      *puVar23 = &PTR__exception_001136c0;
      puVar23[1] = "Nothing to assert";
      *(undefined4 *)(puVar23 + 2) = 0xffffffff;
      __cxa_throw(puVar23,&parse_exc::typeinfo,std::exception::~exception);
    }
    if (!bVar8) goto LAB_0010b17f;
  }
  local_a8 = (Token *)insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty;
  if (iStack_80._M_current == local_78) {
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,&local_a8);
  }
  else {
    *iStack_80._M_current =
         (Token *)insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty;
    iStack_80._M_current = iStack_80._M_current + 1;
  }
LAB_0010b17f:
  pTVar16 = (Token *)operator_new(0x10);
  pTVar16->_vptr_Token = (_func_int **)&PTR__Token_00113a68;
  *(undefined4 *)&pTVar16[1]._vptr_Token = 0;
  local_a8 = pTVar16;
  if (iStack_80._M_current == local_78) {
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,&local_a8);
    pTVar16 = extraout_RAX;
  }
  else {
    *iStack_80._M_current = pTVar16;
    iStack_80._M_current = iStack_80._M_current + 1;
  }
  if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                    super__Vector_impl_data._M_start);
    pTVar16 = extraout_RAX_00;
  }
  if (local_48.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
    pTVar16 = extraout_RAX_01;
  }
  local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_98 = (Pattern **)0x0;
  local_a8 = (Token *)0x0;
  iStack_a0._M_current = (Pattern **)0x0;
  if (local_88 != iStack_80._M_current) {
    local_ac = (uint)CONCAT71((int7)((ulong)pTVar16 >> 8),1);
    local_50 = iStack_80._M_current;
    iVar28._M_current = iStack_80._M_current;
    ppTVar29 = local_88;
    do {
      local_70 = *ppTVar29;
      iVar10 = (*local_70->_vptr_Token[5])();
      pTVar16 = local_70;
      if ((char)iVar10 == '\0') {
        iVar10 = (*local_70->_vptr_Token[4])(local_70);
        if (((char)iVar10 == '\0') && (iVar10 = (*local_70->_vptr_Token[6])(), (char)iVar10 == '\0')
           ) {
          iVar10 = (*local_70->_vptr_Token[2])();
          if ((char)iVar10 == '\0') {
            local_58 = ppTVar29;
            if ((local_ac & 1) != 0) {
              __assert_fail("!expectAtom",
                            "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                            ,0x15c,"AST::Pattern *parse_tokenized(vector<Token *> &)");
            }
LAB_0010b392:
            pTVar16 = local_70;
            plVar5 = *(long **)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                               _M_impl.super__Vector_impl_data._M_finish[-1].x;
            iVar10 = (*local_70->_vptr_Token[8])(local_70);
            iVar13 = (**(code **)(*plVar5 + 0x40))(plVar5);
            if (iVar10 <= iVar13) {
LAB_0010b40c:
              plVar5 = *(long **)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                                 _M_impl.super__Vector_impl_data._M_finish[-1].x;
              local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1].x;
              iVar10 = (**(code **)(*plVar5 + 0x20))(plVar5);
              if ((char)iVar10 == '\0') {
                iVar10 = (**(code **)(*plVar5 + 0x18))(plVar5);
                if ((char)iVar10 != '\0') {
                  lVar15 = __dynamic_cast(plVar5,&Token::typeinfo,&T_Concatenation::typeinfo,0);
                  if (lVar15 == 0) {
                    lVar15 = __dynamic_cast(plVar5,&Token::typeinfo,&T_Alternator::typeinfo,0);
                    if (lVar15 == 0) {
                      __assert_fail("isA<T_Alternator>(op)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                                    ,0x174,"AST::Pattern *parse_tokenized(vector<Token *> &)");
                    }
                    pPVar18 = (Pattern *)operator_new(0x18);
                    ppuVar24 = &PTR__Pattern_00113d70;
                  }
                  else {
                    pPVar18 = (Pattern *)operator_new(0x18);
                    ppuVar24 = &PTR__Pattern_00113d20;
                  }
                  pPVar18->_vptr_Pattern = (_func_int **)ppuVar24;
                  pPVar18[2]._vptr_Pattern = (_func_int **)iStack_a0._M_current[-1];
                  iVar25._M_current = iStack_a0._M_current + -2;
                  pPVar18[1]._vptr_Pattern = (_func_int **)iStack_a0._M_current[-2];
                  local_68._0_8_ = pPVar18;
                  if (iVar25._M_current == local_98) {
                    iStack_a0._M_current = iVar25._M_current;
                    std::vector<AST::Pattern*,std::allocator<AST::Pattern*>>::
                    _M_realloc_insert<AST::Pattern*>
                              ((vector<AST::Pattern*,std::allocator<AST::Pattern*>> *)&local_a8,
                               iVar25,(Pattern **)local_68);
                  }
                  else {
                    *iVar25._M_current = pPVar18;
                    iStack_a0._M_current = iStack_a0._M_current + -1;
                  }
                }
              }
              else {
                lVar15 = __dynamic_cast(plVar5,&Token::typeinfo,&T_Assert::typeinfo,0);
                if (lVar15 == 0) {
                  __assert_fail("ta",
                                "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                                ,0x161,"AST::Pattern *parse_tokenized(vector<Token *> &)");
                }
                pPVar20 = (Pattern *)operator_new(0x18);
                pPVar20->_vptr_Pattern = (_func_int **)&PTR__Pattern_00113ce8;
                *(undefined1 *)&pPVar20[2]._vptr_Pattern = *(undefined1 *)(lVar15 + 8);
                iVar25._M_current = iStack_a0._M_current + -1;
                auVar1 = *(undefined1 (*) [16])(lVar15 + 0x10);
                local_68._0_8_ = auVar1._8_8_;
                local_68._8_4_ = auVar1._0_4_;
                local_68._12_4_ = auVar1._4_4_;
                lVar15 = 0;
                pPVar18 = iStack_a0._M_current[-1];
                iStack_a0._M_current = iVar25._M_current;
                do {
                  pp_Var14 = *(_func_int ***)(local_68 + lVar15);
                  pPVar21 = pPVar18;
                  if (pp_Var14 != (_func_int **)0x0) {
                    pPVar21 = (Pattern *)operator_new(0x18);
                    pPVar21->_vptr_Pattern = (_func_int **)&PTR__Pattern_00113d20;
                    pPVar21[1]._vptr_Pattern = pp_Var14;
                    pPVar21[2]._vptr_Pattern = (_func_int **)pPVar18;
                  }
                  lVar15 = lVar15 + 8;
                  pPVar18 = pPVar21;
                } while (lVar15 != 0x10);
                pPVar20[1]._vptr_Pattern = (_func_int **)pPVar21;
                local_68._0_8_ = pPVar20;
                if (iVar25._M_current == local_98) {
                  std::vector<AST::Pattern*,std::allocator<AST::Pattern*>>::
                  _M_realloc_insert<AST::Pattern*>
                            ((vector<AST::Pattern*,std::allocator<AST::Pattern*>> *)&local_a8,iVar25
                             ,(Pattern **)local_68);
                  ppTVar29 = local_58;
                }
                else {
                  *iVar25._M_current = pPVar20;
                  iStack_a0._M_current = iStack_a0._M_current + 1;
                  ppTVar29 = local_58;
                }
              }
              goto LAB_0010b392;
            }
            lVar15 = __dynamic_cast(pTVar16,&Token::typeinfo,&T_GroupClose::typeinfo,0);
            if (lVar15 == 0) goto LAB_0010b609;
            lVar19 = __dynamic_cast(plVar5,&Token::typeinfo,&T_GroupOpen::typeinfo,0);
            if (lVar19 == 0) {
              __assert_fail("topgo",
                            "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                            ,0x13e,"bool should_eval(Token *, vector<Token *> &)");
            }
            if (*(int *)(lVar19 + 8) != *(int *)(lVar15 + 8)) {
              if (*(int *)(lVar19 + 8) == 0) goto LAB_0010b609;
              goto LAB_0010b40c;
            }
            local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl
                          .super__Vector_impl_data._M_finish[-1].x;
LAB_0010b609:
            iVar10 = (*local_70->_vptr_Token[3])();
            iVar28._M_current = local_50;
            if ((char)iVar10 != '\0') {
              if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_ac = (uint)CONCAT71((uint7)(uint3)((uint)iVar10 >> 8),1);
                std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*const&>
                          ((vector<Token*,std::allocator<Token*>> *)&local_c8,
                           (iterator)
                           local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_70);
              }
              else {
                *(Token **)
                 local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_70;
                local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((long)local_c8.
                                     super__Vector_base<Direction,_std::allocator<Direction>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + 8);
                local_ac = (uint)CONCAT71((int7)((ulong)local_70 >> 8),1);
              }
            }
          }
          else {
            if ((local_ac & 1) == 0) {
              __assert_fail("expectAtom",
                            "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                            ,0x156,"AST::Pattern *parse_tokenized(vector<Token *> &)");
            }
            if ((local_70 == (Token *)0x0) ||
               (lVar15 = __dynamic_cast(local_70,&Token::typeinfo,&T_Pattern::typeinfo,0),
               lVar15 == 0)) {
              __assert_fail("tp",
                            "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                            ,0x159,"AST::Pattern *parse_tokenized(vector<Token *> &)");
            }
            if (iStack_a0._M_current == local_98) {
              std::vector<AST::Pattern*,std::allocator<AST::Pattern*>>::
              _M_realloc_insert<AST::Pattern*const&>
                        ((vector<AST::Pattern*,std::allocator<AST::Pattern*>> *)&local_a8,iStack_a0,
                         (Pattern **)(lVar15 + 8));
            }
            else {
              *iStack_a0._M_current = *(Pattern **)(lVar15 + 8);
              iStack_a0._M_current = iStack_a0._M_current + 1;
            }
            local_ac = 0;
          }
        }
        else {
          if ((local_ac & 1) == 0) {
            __assert_fail("expectAtom",
                          "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                          ,0x153,"AST::Pattern *parse_tokenized(vector<Token *> &)");
          }
          if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*const&>
                      ((vector<Token*,std::allocator<Token*>> *)&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_70);
          }
          else {
            *(Token **)
             local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
             super__Vector_impl_data._M_finish = local_70;
            local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 8);
          }
        }
      }
      else {
        pPVar18 = (Pattern *)operator_new(0x20);
        uVar12 = *(uint *)&pTVar16[1]._vptr_Token;
        uVar3 = *(uint *)((long)&pTVar16[1]._vptr_Token + 4);
        uVar6 = uVar12;
        uVar7 = uVar3;
        if (uVar3 < uVar12) {
          uVar6 = uVar3;
          uVar7 = uVar12;
        }
        pPVar18->_vptr_Pattern = (_func_int **)&PTR__Pattern_00113c98;
        *(uint *)&pPVar18[2]._vptr_Pattern = uVar6;
        *(uint *)((long)&pPVar18[2]._vptr_Pattern + 4) = uVar7;
        *(bool *)&pPVar18[3]._vptr_Pattern = uVar3 < uVar12;
        iVar25._M_current = iStack_a0._M_current + -1;
        pPVar18[1]._vptr_Pattern = (_func_int **)iStack_a0._M_current[-1];
        local_68._0_8_ = pPVar18;
        if (iVar25._M_current == local_98) {
          iStack_a0._M_current = iVar25._M_current;
          std::vector<AST::Pattern*,std::allocator<AST::Pattern*>>::_M_realloc_insert<AST::Pattern*>
                    ((vector<AST::Pattern*,std::allocator<AST::Pattern*>> *)&local_a8,iVar25,
                     (Pattern **)local_68);
        }
        else {
          *iVar25._M_current = pPVar18;
        }
      }
      ppTVar29 = ppTVar29 + 1;
    } while (ppTVar29 != iVar28._M_current);
  }
  if ((long)iStack_a0._M_current - (long)local_a8 != 8) {
    __assert_fail("pstk.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                  ,0x182,"AST::Pattern *parse_tokenized(vector<Token *> &)");
  }
  if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pPVar18 = iStack_a0._M_current[-1];
    iStack_a0._M_current = iStack_a0._M_current + -1;
    if (local_a8 != (Token *)0x0) {
      operator_delete(local_a8);
    }
    if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pPVar22 = compile_top(pPVar18);
    if (local_88 != (Token **)0x0) {
      operator_delete(local_88);
    }
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return pPVar22;
  }
  __assert_fail("opstk.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp",
                0x183,"AST::Pattern *parse_tokenized(vector<Token *> &)");
}

Assistant:

P_Sequence * parse(s_i &prog) {
    auto tokens0 = tokenize(prog);
    auto tokens1 = insert_concatenators(attach_assertion_directions(tokens0));
#ifdef DEBUG_PARSER
    std::cerr << "Preliminary tokens:";
    for (Token* t : tokens0) std::cerr << ' ' << (str)*t;
    std::cerr << "\nModified tokens:";
    for (Token* t : tokens1) std::cerr << ' ' << (str)*t;
    std::cerr << '\n';
#endif
    return compile_top(parse_tokenized(tokens1));
}